

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O2

String * __thiscall
axl::err::StdErrorProvider::getStackErrorDescription
          (String *__return_storage_ptr__,StdErrorProvider *this,ErrorRef *error)

{
  ErrorHdr *pEVar1;
  size_t sVar2;
  ErrorHdr *p;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_68;
  StringRef local_50;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_hdr + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_length + 1) = 0;
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
       (C *)0x0;
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
       (BufHdr *)0x0;
  pEVar1 = (error->super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>).m_p;
  sVar2 = (error->super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>).m_size;
  for (p = pEVar1 + 1; p < (ErrorHdr *)((long)&pEVar1->m_size + sVar2);
      p = (ErrorHdr *)((long)&p->m_size + (ulong)p->m_size)) {
    if ((__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
        m_length != 0) {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=
                (__return_storage_ptr__,": ");
    }
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::BufRef(&BStack_68,p);
    ErrorRef::getDescription(&local_50,(ErrorRef *)&BStack_68);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::append
              (__return_storage_ptr__,&local_50);
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_50);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

sl::String
StdErrorProvider::getStackErrorDescription(const ErrorRef& error) {
	sl::String string;

	const ErrorHdr* p = error + 1;
	const void* end = error.getEnd();

	while (p < end) {
		ASSERT(p->m_size >= sizeof(ErrorHdr));

		if (!string.isEmpty())
			string += ": ";

		string += ErrorRef(p).getDescription();
		p = (ErrorHdr*)((uchar_t*)p + p->m_size);
	}

	return string;
}